

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O3

void jp2_box_dump(jp2_box_t *box,FILE *out)

{
  _func_void_jp2_box_t_ptr_FILE_ptr *UNRECOVERED_JUMPTABLE;
  jp2_boxinfo_t *pjVar1;
  jp2_boxinfo_t *boxinfo;
  jp2_boxinfo_t *pjVar2;
  
  pjVar2 = jp2_boxinfos;
  do {
    if (pjVar2->type == (int)box->type) goto LAB_00116745;
    pjVar1 = pjVar2 + 1;
    pjVar2 = pjVar2 + 1;
  } while (pjVar1->name != (char *)0x0);
  pjVar2 = &jp2_boxinfo_unk;
LAB_00116745:
  fwrite("JP2 box: ",9,1,(FILE *)out);
  fprintf((FILE *)out,"type=%c%s%c (0x%08lx); length=%lu\n",0x22,pjVar2->name,0x22,box->type,
          box->len);
  UNRECOVERED_JUMPTABLE = box->ops->dumpdata;
  if (UNRECOVERED_JUMPTABLE != (_func_void_jp2_box_t_ptr_FILE_ptr *)0x0) {
    (*UNRECOVERED_JUMPTABLE)(box,out);
    return;
  }
  return;
}

Assistant:

void jp2_box_dump(jp2_box_t *box, FILE *out)
{
	const jp2_boxinfo_t *boxinfo;
	boxinfo = jp2_boxinfolookup(box->type);
	assert(boxinfo);

	fprintf(out, "JP2 box: ");
	fprintf(out, "type=%c%s%c (0x%08"PRIxFAST32"); length=%"PRIuFAST32"\n", '"',
	  boxinfo->name, '"', box->type, box->len);
	if (box->ops->dumpdata) {
		(*box->ops->dumpdata)(box, out);
	}
}